

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall Imf_2_5::DwaCompressor::~DwaCompressor(DwaCompressor *this)

{
  Zip *this_00;
  long lVar1;
  
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__DwaCompressor_02f9caf8;
  if (this->_packedAcBuffer != (char *)0x0) {
    operator_delete__(this->_packedAcBuffer);
  }
  if (this->_packedDcBuffer != (char *)0x0) {
    operator_delete__(this->_packedDcBuffer);
  }
  if (this->_rleBuffer != (char *)0x0) {
    operator_delete__(this->_rleBuffer);
  }
  if (this->_outBuffer != (char *)0x0) {
    operator_delete__(this->_outBuffer);
  }
  this_00 = this->_zip;
  if (this_00 != (Zip *)0x0) {
    Zip::~Zip(this_00);
  }
  operator_delete(this_00,0x10);
  for (lVar1 = 0x1d; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    if (*(void **)(this->_min + lVar1 * 2 + -7) != (void *)0x0) {
      operator_delete__(*(void **)(this->_min + lVar1 * 2 + -7));
    }
  }
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  ~vector(&this->_channelRules);
  std::
  _Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ::~_Vector_base(&(this->_cscSets).
                   super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                 );
  std::
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  ::~vector(&this->_channelData);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
               *)&this->_channels);
  Compressor::~Compressor(&this->super_Compressor);
  return;
}

Assistant:

DwaCompressor::~DwaCompressor()
{
    delete[] _packedAcBuffer;
    delete[] _packedDcBuffer;
    delete[] _rleBuffer;
    delete[] _outBuffer;
    delete _zip;

    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
        delete[] _planarUncBuffer[i];
}